

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaL_openlibs(lua_State *L)

{
  luaL_Reg *local_18;
  luaL_Reg *lib;
  lua_State *L_local;
  
  for (local_18 = lualibs; local_18->func != (lua_CFunction)0x0; local_18 = local_18 + 1) {
    lua_pushcclosure(L,local_18->func,0);
    lua_pushstring(L,local_18->name);
    lua_call(L,1,0);
  }
  return;
}

Assistant:

static void luaL_openlibs(lua_State*L){
const luaL_Reg*lib=lualibs;
for(;lib->func;lib++){
lua_pushcfunction(L,lib->func);
lua_pushstring(L,lib->name);
lua_call(L,1,0);
}
}